

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseEntityDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  entityDeclSAXFunc p_Var3;
  unparsedEntityDeclSAXFunc p_Var4;
  _xmlSAXHandler *p_Var5;
  xmlParserErrors code;
  int iVar6;
  xmlParserInputPtr pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlDocPtr pxVar10;
  xmlDtdPtr pxVar11;
  xmlChar *str;
  xmlChar *pxVar12;
  xmlEntityPtr pxVar13;
  xmlChar xVar14;
  xmlChar *orig;
  xmlChar *literal;
  
  literal = (xmlChar *)0x0;
  orig = (xmlChar *)0x0;
  pxVar7 = ctxt->input;
  pxVar8 = pxVar7->cur;
  if (*pxVar8 != '<') {
    return;
  }
  if (pxVar8[1] != '!') {
    return;
  }
  pxVar9 = pxVar8 + 2;
  pxVar7->cur = pxVar9;
  pxVar7->col = pxVar7->col + 2;
  xVar14 = pxVar8[2];
  if (xVar14 == '\0') {
    xmlParserGrow(ctxt);
    pxVar7 = ctxt->input;
    pxVar9 = pxVar7->cur;
    xVar14 = *pxVar9;
  }
  if (xVar14 != 'E') {
    return;
  }
  if (pxVar9[1] != 'N') {
    return;
  }
  if (pxVar9[2] != 'T') {
    return;
  }
  if (pxVar9[3] != 'I') {
    return;
  }
  if (pxVar9[4] != 'T') {
    return;
  }
  if (pxVar9[5] != 'Y') {
    return;
  }
  iVar2 = pxVar7->id;
  pxVar7->cur = pxVar9 + 6;
  pxVar7->col = pxVar7->col + 6;
  if (pxVar9[6] == '\0') {
    xmlParserGrow(ctxt);
  }
  iVar6 = xmlSkipBlankCharsPE(ctxt);
  if (iVar6 == 0) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'<!ENTITY\'\n");
  }
  xVar14 = *ctxt->input->cur;
  if (xVar14 == '%') {
    xmlNextChar(ctxt);
    iVar6 = xmlSkipBlankCharsPE(ctxt);
    if (iVar6 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'%%\'\n");
    }
  }
  pxVar8 = xmlParseName(ctxt);
  if (pxVar8 == (xmlChar *)0x0) {
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseEntityDecl: no name\n");
    return;
  }
  pxVar9 = xmlStrchr(pxVar8,':');
  if (pxVar9 != (xmlChar *)0x0) {
    xmlNsErr(ctxt,XML_NS_ERR_COLON,"colons are forbidden from entities names \'%s\'\n",pxVar8,
             (xmlChar *)0x0,(xmlChar *)0x0);
  }
  iVar6 = xmlSkipBlankCharsPE(ctxt);
  if (iVar6 == 0) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after the entity name\n");
  }
  xVar1 = *ctxt->input->cur;
  if (xVar14 == '%') {
    if ((xVar1 != '\'') && (xVar1 != '\"')) {
      str = xmlParseExternalID(ctxt,&literal,1);
      pxVar9 = literal;
      if (str == (xmlChar *)0x0 && literal == (xmlChar *)0x0) {
        xmlFatalErr(ctxt,XML_ERR_VALUE_REQUIRED,(char *)0x0);
      }
      else if (str != (xmlChar *)0x0) {
        pxVar12 = xmlStrchr(str,'#');
        if (pxVar12 == (xmlChar *)0x0) {
          if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
             (p_Var3 = ctxt->sax->entityDecl, p_Var3 != (entityDeclSAXFunc)0x0)) {
            (*p_Var3)(ctxt->userData,pxVar8,5,pxVar9,str,(xmlChar *)0x0);
          }
        }
        else {
          xmlFatalErr(ctxt,XML_ERR_URI_FRAGMENT,(char *)0x0);
        }
        goto LAB_0013761c;
      }
      str = (xmlChar *)0x0;
      goto LAB_0013761c;
    }
    pxVar9 = xmlParseEntityValue(ctxt,&orig);
    if (pxVar9 == (xmlChar *)0x0) {
      pxVar9 = (xmlChar *)0x0;
    }
    else if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
            (p_Var3 = ctxt->sax->entityDecl, p_Var3 != (entityDeclSAXFunc)0x0)) {
      str = (xmlChar *)0x0;
      (*p_Var3)(ctxt->userData,pxVar8,4,(xmlChar *)0x0,(xmlChar *)0x0,pxVar9);
      goto LAB_00137621;
    }
LAB_001373e0:
    str = (xmlChar *)0x0;
LAB_00137621:
    xmlSkipBlankCharsPE(ctxt);
    if (*ctxt->input->cur == '>') {
      if (iVar2 != ctxt->input->id) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "Entity declaration doesn\'t start and stop in the same entity\n");
      }
      xmlNextChar(ctxt);
    }
    else {
      xmlFatalErrMsgStr(ctxt,XML_ERR_ENTITY_NOT_FINISHED,
                        "xmlParseEntityDecl: entity %s not terminated\n",pxVar8);
      xmlHaltParser(ctxt);
    }
    if (orig != (xmlChar *)0x0) {
      p_Var5 = ctxt->sax;
      if (xVar14 == '%') {
        if ((p_Var5 != (_xmlSAXHandler *)0x0) &&
           (p_Var5->getParameterEntity != (getParameterEntitySAXFunc)0x0)) {
          pxVar13 = (*p_Var5->getParameterEntity)(ctxt->userData,pxVar8);
LAB_001376cf:
          if (pxVar13 != (xmlEntityPtr)0x0) goto LAB_001376d4;
        }
      }
      else if (((p_Var5 == (_xmlSAXHandler *)0x0) || (p_Var5->getEntity == (getEntitySAXFunc)0x0))
              || (pxVar13 = (*p_Var5->getEntity)(ctxt->userData,pxVar8),
                 pxVar13 == (xmlEntityPtr)0x0)) {
        if ((xmlParserCtxtPtr)ctxt->userData == ctxt) {
          pxVar13 = xmlSAX2GetEntity(ctxt,pxVar8);
          goto LAB_001376cf;
        }
      }
      else {
LAB_001376d4:
        if (pxVar13->orig == (xmlChar *)0x0) {
          pxVar13->orig = orig;
          orig = (xmlChar *)0x0;
        }
      }
    }
  }
  else {
    if ((xVar1 != '\'') && (xVar1 != '\"')) {
      str = xmlParseExternalID(ctxt,&literal,1);
      pxVar9 = literal;
      if (str == (xmlChar *)0x0 && literal == (xmlChar *)0x0) {
        code = XML_ERR_VALUE_REQUIRED;
LAB_00137441:
        xmlFatalErr(ctxt,code,(char *)0x0);
      }
      else if ((str != (xmlChar *)0x0) && (pxVar12 = xmlStrchr(str,'#'), pxVar12 != (xmlChar *)0x0))
      {
        code = XML_ERR_URI_FRAGMENT;
        goto LAB_00137441;
      }
      if ((*ctxt->input->cur != '>') && (iVar6 = xmlSkipBlankCharsPE(ctxt), iVar6 == 0)) {
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required before \'NDATA\'\n");
      }
      pxVar7 = ctxt->input;
      pxVar12 = pxVar7->cur;
      if ((((*pxVar12 == 'N') && (pxVar12[1] == 'D')) && (pxVar12[2] == 'A')) &&
         ((pxVar12[3] == 'T' && (pxVar12[4] == 'A')))) {
        pxVar7->cur = pxVar12 + 5;
        pxVar7->col = pxVar7->col + 5;
        if (pxVar12[5] == '\0') {
          xmlParserGrow(ctxt);
        }
        iVar6 = xmlSkipBlankCharsPE(ctxt);
        if (iVar6 == 0) {
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'NDATA\'\n");
        }
        pxVar12 = xmlParseName(ctxt);
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var4 = ctxt->sax->unparsedEntityDecl, p_Var4 != (unparsedEntityDeclSAXFunc)0x0)) {
          (*p_Var4)(ctxt->userData,pxVar8,pxVar9,str,pxVar12);
        }
      }
      else {
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var3 = ctxt->sax->entityDecl, p_Var3 != (entityDeclSAXFunc)0x0)) {
          (*p_Var3)(ctxt->userData,pxVar8,2,pxVar9,str,(xmlChar *)0x0);
        }
        if (ctxt->replaceEntities != 0) {
          if (ctxt->myDoc == (xmlDocPtr)0x0) {
LAB_0013758d:
            pxVar10 = xmlNewDoc((xmlChar *)"SAX compatibility mode document");
            ctxt->myDoc = pxVar10;
            if (pxVar10 == (xmlDocPtr)0x0) {
LAB_001375f7:
              xmlCtxtErrMemory(ctxt);
              goto LAB_001376fb;
            }
            pxVar10->properties = 0x40;
LAB_001375ac:
            if (pxVar10->intSubset == (_xmlDtd *)0x0) {
              pxVar11 = xmlNewDtd(pxVar10,(xmlChar *)"fake",(xmlChar *)0x0,(xmlChar *)0x0);
              ctxt->myDoc->intSubset = pxVar11;
              if (pxVar11 == (xmlDtdPtr)0x0) goto LAB_001375f7;
            }
            xmlSAX2EntityDecl(ctxt,pxVar8,2,pxVar9,str,(xmlChar *)0x0);
          }
          else {
            iVar6 = xmlStrEqual(ctxt->myDoc->version,(xmlChar *)"SAX compatibility mode document");
            if (iVar6 != 0) {
              pxVar10 = ctxt->myDoc;
              if (pxVar10 == (xmlDocPtr)0x0) goto LAB_0013758d;
              goto LAB_001375ac;
            }
          }
        }
      }
LAB_0013761c:
      pxVar9 = (xmlChar *)0x0;
      goto LAB_00137621;
    }
    pxVar9 = xmlParseEntityValue(ctxt,&orig);
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       ((ctxt->disableSAX == 0 && (p_Var3 = ctxt->sax->entityDecl, p_Var3 != (entityDeclSAXFunc)0x0)
        ))) {
      (*p_Var3)(ctxt->userData,pxVar8,1,(xmlChar *)0x0,(xmlChar *)0x0,pxVar9);
    }
    if (ctxt->myDoc != (xmlDocPtr)0x0) {
      iVar6 = xmlStrEqual(ctxt->myDoc->version,(xmlChar *)"SAX compatibility mode document");
      if (iVar6 == 0) goto LAB_001373e0;
      pxVar10 = ctxt->myDoc;
      if (pxVar10 == (xmlDocPtr)0x0) goto LAB_00137310;
LAB_00137333:
      if (pxVar10->intSubset == (_xmlDtd *)0x0) {
        pxVar11 = xmlNewDtd(pxVar10,(xmlChar *)"fake",(xmlChar *)0x0,(xmlChar *)0x0);
        ctxt->myDoc->intSubset = pxVar11;
        if (pxVar11 == (xmlDtdPtr)0x0) goto LAB_001373e8;
      }
      str = (xmlChar *)0x0;
      xmlSAX2EntityDecl(ctxt,pxVar8,1,(xmlChar *)0x0,(xmlChar *)0x0,pxVar9);
      goto LAB_00137621;
    }
LAB_00137310:
    pxVar10 = xmlNewDoc((xmlChar *)"SAX compatibility mode document");
    ctxt->myDoc = pxVar10;
    if (pxVar10 != (xmlDocPtr)0x0) {
      pxVar10->properties = 0x40;
      goto LAB_00137333;
    }
LAB_001373e8:
    xmlCtxtErrMemory(ctxt);
    str = (xmlChar *)0x0;
  }
  if (pxVar9 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar9);
  }
LAB_001376fb:
  if (str != (xmlChar *)0x0) {
    (*xmlFree)(str);
  }
  if (literal != (xmlChar *)0x0) {
    (*xmlFree)(literal);
  }
  if (orig != (xmlChar *)0x0) {
    (*xmlFree)(orig);
  }
  return;
}

Assistant:

void
xmlParseEntityDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name = NULL;
    xmlChar *value = NULL;
    xmlChar *URI = NULL, *literal = NULL;
    const xmlChar *ndata = NULL;
    int isParameter = 0;
    xmlChar *orig = NULL;

    if ((CUR != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);

    /* GROW; done in the caller */
    if (CMP6(CUR_PTR, 'E', 'N', 'T', 'I', 'T', 'Y')) {
	int inputid = ctxt->input->id;
	SKIP(6);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '<!ENTITY'\n");
	}

	if (RAW == '%') {
	    NEXT;
	    if (SKIP_BLANKS_PE == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			       "Space required after '%%'\n");
	    }
	    isParameter = 1;
	}

        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	                   "xmlParseEntityDecl: no name\n");
            return;
	}
	if (xmlStrchr(name, ':') != NULL) {
	    xmlNsErr(ctxt, XML_NS_ERR_COLON,
		     "colons are forbidden from entities names '%s'\n",
		     name, NULL, NULL);
	}
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after the entity name\n");
	}

	/*
	 * handle the various case of definitions...
	 */
	if (isParameter) {
	    if ((RAW == '"') || (RAW == '\'')) {
	        value = xmlParseEntityValue(ctxt, &orig);
		if (value) {
		    if ((ctxt->sax != NULL) &&
			(!ctxt->disableSAX) && (ctxt->sax->entityDecl != NULL))
			ctxt->sax->entityDecl(ctxt->userData, name,
		                    XML_INTERNAL_PARAMETER_ENTITY,
				    NULL, NULL, value);
		}
	    } else {
	        URI = xmlParseExternalID(ctxt, &literal, 1);
		if ((URI == NULL) && (literal == NULL)) {
		    xmlFatalErr(ctxt, XML_ERR_VALUE_REQUIRED, NULL);
		}
		if (URI) {
                    if (xmlStrchr(URI, '#')) {
                        xmlFatalErr(ctxt, XML_ERR_URI_FRAGMENT, NULL);
                    } else {
                        if ((ctxt->sax != NULL) &&
                            (!ctxt->disableSAX) &&
                            (ctxt->sax->entityDecl != NULL))
                            ctxt->sax->entityDecl(ctxt->userData, name,
                                        XML_EXTERNAL_PARAMETER_ENTITY,
                                        literal, URI, NULL);
                    }
		}
	    }
	} else {
	    if ((RAW == '"') || (RAW == '\'')) {
	        value = xmlParseEntityValue(ctxt, &orig);
		if ((ctxt->sax != NULL) &&
		    (!ctxt->disableSAX) && (ctxt->sax->entityDecl != NULL))
		    ctxt->sax->entityDecl(ctxt->userData, name,
				XML_INTERNAL_GENERAL_ENTITY,
				NULL, NULL, value);
		/*
		 * For expat compatibility in SAX mode.
		 */
		if ((ctxt->myDoc == NULL) ||
		    (xmlStrEqual(ctxt->myDoc->version, SAX_COMPAT_MODE))) {
		    if (ctxt->myDoc == NULL) {
			ctxt->myDoc = xmlNewDoc(SAX_COMPAT_MODE);
			if (ctxt->myDoc == NULL) {
			    xmlErrMemory(ctxt);
			    goto done;
			}
			ctxt->myDoc->properties = XML_DOC_INTERNAL;
		    }
		    if (ctxt->myDoc->intSubset == NULL) {
			ctxt->myDoc->intSubset = xmlNewDtd(ctxt->myDoc,
					    BAD_CAST "fake", NULL, NULL);
                        if (ctxt->myDoc->intSubset == NULL) {
                            xmlErrMemory(ctxt);
                            goto done;
                        }
                    }

		    xmlSAX2EntityDecl(ctxt, name, XML_INTERNAL_GENERAL_ENTITY,
			              NULL, NULL, value);
		}
	    } else {
	        URI = xmlParseExternalID(ctxt, &literal, 1);
		if ((URI == NULL) && (literal == NULL)) {
		    xmlFatalErr(ctxt, XML_ERR_VALUE_REQUIRED, NULL);
		}
		if (URI) {
                    if (xmlStrchr(URI, '#')) {
                        xmlFatalErr(ctxt, XML_ERR_URI_FRAGMENT, NULL);
                    }
		}
		if ((RAW != '>') && (SKIP_BLANKS_PE == 0)) {
		    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
				   "Space required before 'NDATA'\n");
		}
		if (CMP5(CUR_PTR, 'N', 'D', 'A', 'T', 'A')) {
		    SKIP(5);
		    if (SKIP_BLANKS_PE == 0) {
			xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
				       "Space required after 'NDATA'\n");
		    }
		    ndata = xmlParseName(ctxt);
		    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		        (ctxt->sax->unparsedEntityDecl != NULL))
			ctxt->sax->unparsedEntityDecl(ctxt->userData, name,
				    literal, URI, ndata);
		} else {
		    if ((ctxt->sax != NULL) &&
		        (!ctxt->disableSAX) && (ctxt->sax->entityDecl != NULL))
			ctxt->sax->entityDecl(ctxt->userData, name,
				    XML_EXTERNAL_GENERAL_PARSED_ENTITY,
				    literal, URI, NULL);
		    /*
		     * For expat compatibility in SAX mode.
		     * assuming the entity replacement was asked for
		     */
		    if ((ctxt->replaceEntities != 0) &&
			((ctxt->myDoc == NULL) ||
			(xmlStrEqual(ctxt->myDoc->version, SAX_COMPAT_MODE)))) {
			if (ctxt->myDoc == NULL) {
			    ctxt->myDoc = xmlNewDoc(SAX_COMPAT_MODE);
			    if (ctxt->myDoc == NULL) {
			        xmlErrMemory(ctxt);
				goto done;
			    }
			    ctxt->myDoc->properties = XML_DOC_INTERNAL;
			}

			if (ctxt->myDoc->intSubset == NULL) {
			    ctxt->myDoc->intSubset = xmlNewDtd(ctxt->myDoc,
						BAD_CAST "fake", NULL, NULL);
                            if (ctxt->myDoc->intSubset == NULL) {
                                xmlErrMemory(ctxt);
                                goto done;
                            }
                        }
			xmlSAX2EntityDecl(ctxt, name,
				          XML_EXTERNAL_GENERAL_PARSED_ENTITY,
				          literal, URI, NULL);
		    }
		}
	    }
	}
	SKIP_BLANKS_PE;
	if (RAW != '>') {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_ENTITY_NOT_FINISHED,
	            "xmlParseEntityDecl: entity %s not terminated\n", name);
	    xmlHaltParser(ctxt);
	} else {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                       "Entity declaration doesn't start and stop in"
                               " the same entity\n");
	    }
	    NEXT;
	}
	if (orig != NULL) {
	    /*
	     * Ugly mechanism to save the raw entity value.
	     */
	    xmlEntityPtr cur = NULL;

	    if (isParameter) {
	        if ((ctxt->sax != NULL) &&
		    (ctxt->sax->getParameterEntity != NULL))
		    cur = ctxt->sax->getParameterEntity(ctxt->userData, name);
	    } else {
	        if ((ctxt->sax != NULL) &&
		    (ctxt->sax->getEntity != NULL))
		    cur = ctxt->sax->getEntity(ctxt->userData, name);
		if ((cur == NULL) && (ctxt->userData==ctxt)) {
		    cur = xmlSAX2GetEntity(ctxt, name);
		}
	    }
            if ((cur != NULL) && (cur->orig == NULL)) {
		cur->orig = orig;
                orig = NULL;
	    }
	}

done:
	if (value != NULL) xmlFree(value);
	if (URI != NULL) xmlFree(URI);
	if (literal != NULL) xmlFree(literal);
        if (orig != NULL) xmlFree(orig);
    }
}